

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio-lite.cpp
# Opt level: O0

void archivateFiles(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *filesToArchivate,string *pathToOutArchive)

{
  bool bVar1;
  ushort uVar2;
  reference pbVar3;
  void *buf;
  pointer pcVar4;
  unsigned_long *puVar5;
  CpioException *this;
  exception *e;
  string local_178;
  tuple<char_*,_std::default_delete<char[]>_> local_158;
  size_t local_150;
  ssize_t sz;
  __array bufPtr_1;
  __off_t leftToCopy;
  size_t sStack_130;
  DescriptorWrapper fdToArchivate;
  ssize_t size;
  __array bufPtr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  stat st;
  ushort uStack_54;
  char additionalNullTerminator;
  header_old_cpio header;
  DescriptorWrapper fdArch;
  DescriptorWrapper fd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string *pathToOutArchive_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filesToArchivate_local;
  
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(filesToArchivate);
  filename = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(filesToArchivate);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&filename), bVar1) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    DescriptorWrapper::openFile((DescriptorWrapper *)header.c_filesize,pbVar3,0);
    DescriptorWrapper::~DescriptorWrapper((DescriptorWrapper *)header.c_filesize);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  DescriptorWrapper::createFile
            ((DescriptorWrapper *)(header.c_mtime + 1),pathToOutArchive,0x41,0x1b4);
  st.__glibc_reserved[2]._5_1_ = 0;
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(filesToArchivate);
  filename_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(filesToArchivate);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&filename_1);
    if (!bVar1) {
      e._0_2_ = header.c_mtime[1];
      e._2_2_ = header.c_namesize;
      writeTrailer((DescriptorWrapper *)&e);
      DescriptorWrapper::~DescriptorWrapper((DescriptorWrapper *)&e);
      DescriptorWrapper::~DescriptorWrapper((DescriptorWrapper *)(header.c_mtime + 1));
      return;
    }
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_1);
    PosixWrapper::lstat_(pbVar3,(stat *)&__range1_1);
    fillInHeader((header_old_cpio *)((long)st.__glibc_reserved + 0x16),(stat *)&__range1_1,pbVar3);
    DescriptorWrapper::writeFrom
              ((DescriptorWrapper *)(header.c_mtime + 1),(void *)((long)st.__glibc_reserved + 0x16),
               0x1a);
    buf = (void *)std::__cxx11::string::c_str();
    DescriptorWrapper::writeFrom
              ((DescriptorWrapper *)(header.c_mtime + 1),buf,(ulong)header.c_nlink);
    if ((uint)header.c_nlink % 2 == 1) {
      DescriptorWrapper::writeFrom
                ((DescriptorWrapper *)(header.c_mtime + 1),
                 (void *)((long)st.__glibc_reserved + 0x15),1);
    }
    uVar2 = uStack_54 & 0xf000;
    if ((((uVar2 != 0x1000) && (uVar2 != 0x2000)) && (uVar2 != 0x4000)) && (uVar2 != 0x6000)) {
      if (uVar2 == 0x8000) {
        DescriptorWrapper::openFile((DescriptorWrapper *)((long)&leftToCopy + 4),pbVar3,0);
        bufPtr_1._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
             (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)st.st_rdev;
        std::make_unique<char[]>((size_t)&sz);
        for (; 0 < (long)bufPtr_1._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                         _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                         super__Head_base<0UL,_char_*,_false>._M_head_impl;
            bufPtr_1._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
            super__Head_base<0UL,_char_*,_false>._M_head_impl =
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 ((long)bufPtr_1._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t
                        .super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                        super__Head_base<0UL,_char_*,_false>._M_head_impl - local_150)) {
          pcVar4 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                             ((unique_ptr<char[],_std::default_delete<char[]>_> *)&sz);
          local_158.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)
               (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)
               bufPtr_1._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
          puVar5 = std::min<unsigned_long>(&BUFFER_BLOCK,(unsigned_long *)&local_158);
          local_150 = DescriptorWrapper::readTo
                                ((DescriptorWrapper *)((long)&leftToCopy + 4),pcVar4,*puVar5);
          pcVar4 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                             ((unique_ptr<char[],_std::default_delete<char[]>_> *)&sz);
          DescriptorWrapper::writeFrom((DescriptorWrapper *)(header.c_mtime + 1),pcVar4,local_150);
        }
        if ((long)st.st_rdev % 2 == 1) {
          DescriptorWrapper::writeFrom
                    ((DescriptorWrapper *)(header.c_mtime + 1),
                     (void *)((long)st.__glibc_reserved + 0x15),1);
        }
        std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                  ((unique_ptr<char[],_std::default_delete<char[]>_> *)&sz);
        DescriptorWrapper::~DescriptorWrapper((DescriptorWrapper *)((long)&leftToCopy + 4));
      }
      else if (uVar2 == 0xa000) {
        std::make_unique<char[]>((size_t)&size);
        pcVar4 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                           ((unique_ptr<char[],_std::default_delete<char[]>_> *)&size);
        sStack_130 = PosixWrapper::readlink_(pbVar3,pcVar4,st.st_rdev);
        pcVar4 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                           ((unique_ptr<char[],_std::default_delete<char[]>_> *)&size);
        DescriptorWrapper::writeFrom((DescriptorWrapper *)(header.c_mtime + 1),pcVar4,sStack_130);
        if ((long)sStack_130 % 2 == 1) {
          DescriptorWrapper::writeFrom
                    ((DescriptorWrapper *)(header.c_mtime + 1),
                     (void *)((long)st.__glibc_reserved + 0x15),1);
        }
        std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                  ((unique_ptr<char[],_std::default_delete<char[]>_> *)&size);
      }
      else if (uVar2 != 0xc000) {
        e._6_1_ = 1;
        this = (CpioException *)__cxa_allocate_exception(0x18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,"Unknown filetype",(allocator<char> *)((long)&e + 7));
        CpioException::CpioException(this,InvalidInputFileToArchive,&local_178);
        e._6_1_ = 0;
        __cxa_throw(this,&CpioException::typeinfo,CpioException::~CpioException);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  } while( true );
}

Assistant:

void archivateFiles(const vector<string>& filesToArchivate, const string& pathToOutArchive) 
{
	// check all files can be opened
	for (const auto& filename: filesToArchivate) {
		DescriptorWrapper fd = DescriptorWrapper::openFile(filename, O_RDONLY);
	}

	auto fdArch = DescriptorWrapper::createFile(pathToOutArchive, O_WRONLY | O_CREAT, ACCESS_RW_RW_R__);
	header_old_cpio header;
	char additionalNullTerminator = 0;
	struct stat st;

	try
	{
		for (const auto& filename: filesToArchivate) {
			PosixWrapper::lstat_(filename, st);
			fillInHeader(header, st, filename);
			// write header 
			fdArch.writeFrom(&header, sizeof(header_old_cpio));
			// write filename
			fdArch.writeFrom((void*)filename.c_str(), header.c_namesize);
			if (header.c_namesize % 2 == 1)
				fdArch.writeFrom(&additionalNullTerminator, 1);
			// write file content 
			switch (header.c_mode & CP_IFMT) {
		    	case S_IFDIR:
				case S_IFCHR:
		    	case S_IFBLK:
		    	case S_IFSOCK:
		    	case S_IFIFO:
		    	{
		    		break;
		    	}
		    	case S_IFLNK:
		    	{
		    		auto bufPtr = make_unique<char[]>(st.st_size);
	    			auto size = PosixWrapper::readlink_(filename, bufPtr.get(), st.st_size);
	    			fdArch.writeFrom(bufPtr.get(), size);
	    			if (size % 2 == 1)
	    				fdArch.writeFrom(&additionalNullTerminator, 1);
		    		
		    		break;
		    	}
		    	case S_IFREG:
		    	{
					auto fdToArchivate = DescriptorWrapper::openFile(filename, O_RDONLY); 
					auto leftToCopy = st.st_size;
					auto bufPtr = make_unique<char[]>(BUFFER_BLOCK);
					while (leftToCopy > 0)
					{
						auto sz = fdToArchivate.readTo(bufPtr.get(), min<unsigned long>(BUFFER_BLOCK, leftToCopy));
						fdArch.writeFrom(bufPtr.get(), sz);
						leftToCopy -= sz;
					}
					if (st.st_size % 2 == 1)
						fdArch.writeFrom(&additionalNullTerminator, 1);
					
					break;
				}
				default:
				{
					throw CpioException(CpioException::InvalidInputFileToArchive, "Unknown filetype");
				}
			}
		}

		writeTrailer(fdArch);
	}
	catch (exception& e) 
	{
		unlink(pathToOutArchive.c_str());
		throw;
	}

	return;
}